

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclMarkSkippedCells(SC_Lib *p)

{
  int i;
  FILE *__stream;
  char *pcVar1;
  void *pvVar2;
  char Buffer [1000];
  char FileName [1000];
  uint local_814;
  char local_808 [1008];
  char local_418 [1000];
  
  sprintf(local_418,"%s.skip",p->pName);
  __stream = fopen(local_418,"rb");
  if (__stream != (FILE *)0x0) {
    local_814 = 0;
    while( true ) {
      pcVar1 = fgets(local_808,999,__stream);
      if (pcVar1 == (char *)0x0) break;
      pcVar1 = strtok(local_808,"\r\n\t ");
      if (pcVar1 != (char *)0x0) {
        i = Abc_SclCellFind(p,pcVar1);
        if (i == -1) {
          printf("Cannot find cell \"%s\" in the library \"%s\".\n",pcVar1,p->pName);
        }
        else {
          pvVar2 = Vec_PtrEntry(&p->vCells,i);
          *(undefined4 *)((long)pvVar2 + 0xc) = 1;
          local_814 = local_814 + 1;
        }
      }
    }
    fclose(__stream);
    printf("Marked %d cells for skipping in the library \"%s\".\n",(ulong)local_814,p->pName);
  }
  return;
}

Assistant:

void Abc_SclMarkSkippedCells( SC_Lib * p )
{
    char FileName[1000];
    char Buffer[1000], * pName;
    SC_Cell * pCell;
    FILE * pFile;
    int CellId, nSkipped = 0;
    sprintf( FileName, "%s.skip", p->pName );
    pFile = fopen( FileName, "rb" );
    if ( pFile == NULL )
        return;
    while ( fgets( Buffer, 999, pFile ) != NULL )
    {
        pName = strtok( Buffer, "\r\n\t " );
        if ( pName == NULL )
            continue;
        CellId = Abc_SclCellFind( p, pName );
        if ( CellId == -1 )
        {
            printf( "Cannot find cell \"%s\" in the library \"%s\".\n", pName, p->pName );
            continue;
        }
        pCell = SC_LibCell( p, CellId );
        pCell->fSkip = 1;
        nSkipped++;
    }
    fclose( pFile );
    printf( "Marked %d cells for skipping in the library \"%s\".\n", nSkipped, p->pName );
}